

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

ssize_t tnt_buf_writev(tnt_stream *s,iovec *iov,int count)

{
  void *local_40;
  char *p;
  tnt_stream *ptStack_30;
  int i;
  size_t size;
  int count_local;
  iovec *iov_local;
  tnt_stream *s_local;
  
  if (*(int *)((long)s->data + 0x38) == 1) {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  else {
    ptStack_30 = (tnt_stream *)0x0;
    for (p._4_4_ = 0; p._4_4_ < count; p._4_4_ = p._4_4_ + 1) {
      ptStack_30 = (tnt_stream *)((long)&ptStack_30->alloc + iov[p._4_4_].iov_len);
    }
    local_40 = (void *)(**(code **)((long)s->data + 0x20))(s,ptStack_30);
    if (local_40 == (void *)0x0) {
      s_local = (tnt_stream *)0xffffffffffffffff;
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < count; p._4_4_ = p._4_4_ + 1) {
        memcpy(local_40,iov[p._4_4_].iov_base,iov[p._4_4_].iov_len);
        local_40 = (void *)(iov[p._4_4_].iov_len + (long)local_40);
      }
      *(long *)((long)s->data + 8) = (long)&ptStack_30->alloc + *(long *)((long)s->data + 8);
      s->wrcnt = s->wrcnt + 1;
      s_local = ptStack_30;
    }
  }
  return (ssize_t)s_local;
}

Assistant:

static ssize_t
tnt_buf_writev(struct tnt_stream *s, struct iovec *iov, int count) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	for (i = 0 ; i < count ; i++) {
		memcpy(p, iov[i].iov_base, iov[i].iov_len);
		p += iov[i].iov_len;
	}
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}